

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float_math.cpp
# Opt level: O2

void fm_quatRotate(float *quat,float *v,float *r)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  
  fVar1 = quat[1];
  fVar2 = quat[3];
  fVar3 = v[1];
  auVar10 = ZEXT416((uint)*v);
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * v[2])),ZEXT416((uint)fVar2),auVar10);
  auVar5 = vfmadd231ss_fma(ZEXT416((uint)(*v * quat[2])),ZEXT416((uint)fVar2),ZEXT416((uint)fVar3));
  auVar9 = ZEXT416((uint)v[2]);
  auVar6 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * *quat)),ZEXT416((uint)fVar2),auVar9);
  auVar11 = ZEXT416((uint)quat[2]);
  auVar7 = vfnmadd231ss_fma(auVar4,ZEXT416((uint)fVar3),auVar11);
  auVar8 = ZEXT416((uint)*quat);
  auVar5 = vfnmadd231ss_fma(auVar5,auVar9,auVar8);
  auVar6 = vfnmadd231ss_fma(auVar6,auVar10,ZEXT416((uint)fVar1));
  auVar4 = vfnmsub231ss_fma(ZEXT416((uint)(fVar3 * fVar1)),auVar8,auVar10);
  auVar9 = vfnmadd231ss_fma(auVar4,auVar11,auVar9);
  auVar4 = vfnmadd231ss_fma(ZEXT416((uint)(fVar2 * auVar7._0_4_)),auVar9,auVar8);
  auVar4 = vfnmadd231ss_fma(auVar4,auVar5,auVar11);
  auVar4 = vfmadd231ss_fma(auVar4,auVar6,ZEXT416((uint)fVar1));
  *r = auVar4._0_4_;
  auVar4 = vfnmadd231ss_fma(ZEXT416((uint)(auVar5._0_4_ * quat[3])),auVar9,ZEXT416((uint)quat[1]));
  auVar4 = vfnmadd231ss_fma(auVar4,auVar6,ZEXT416((uint)*quat));
  auVar4 = vfmadd231ss_fma(auVar4,auVar7,ZEXT416((uint)quat[2]));
  r[1] = auVar4._0_4_;
  auVar4 = vfnmadd231ss_fma(ZEXT416((uint)(auVar6._0_4_ * quat[3])),auVar9,ZEXT416((uint)quat[2]));
  auVar4 = vfnmadd231ss_fma(auVar4,auVar7,ZEXT416((uint)quat[1]));
  auVar4 = vfmadd231ss_fma(auVar4,auVar5,ZEXT416((uint)*quat));
  r[2] = auVar4._0_4_;
  return;
}

Assistant:

void fm_quatRotate(const float *quat,const float *v,float *r) // rotate a vector directly by a quaternion.
{
  float left[4];

	left[0] =   quat[3]*v[0] + quat[1]*v[2] - v[1]*quat[2];
	left[1] =   quat[3]*v[1] + quat[2]*v[0] - v[2]*quat[0];
	left[2] =   quat[3]*v[2] + quat[0]*v[1] - v[0]*quat[1];
	left[3] = - quat[0]*v[0] - quat[1]*v[1] - quat[2]*v[2];

	r[0] = (left[3]*-quat[0]) + (quat[3]*left[0]) + (left[1]*-quat[2]) - (-quat[1]*left[2]);
	r[1] = (left[3]*-quat[1]) + (quat[3]*left[1]) + (left[2]*-quat[0]) - (-quat[2]*left[0]);
	r[2] = (left[3]*-quat[2]) + (quat[3]*left[2]) + (left[0]*-quat[1]) - (-quat[0]*left[1]);

}